

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * comma_print(unsigned_long n)

{
  char cVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  lconv *plVar4;
  ulong uVar5;
  char *pcVar6;
  ulong in_RDI;
  bool bVar7;
  lconv *lcp;
  int i;
  char *p;
  int comma;
  int local_1c;
  char *local_18;
  ulong local_8;
  
  cVar1 = '\0';
  local_1c = 0;
  if (0xf < commaPrintBufIndex) {
    commaPrintBufIndex = '\0';
  }
  uVar5 = (ulong)commaPrintBufIndex;
  plVar4 = localeconv();
  if (plVar4 != (lconv *)0x0) {
    if ((plVar4->thousands_sep == (char *)0x0) || (*plVar4->thousands_sep == '\0')) {
      cVar1 = ',';
    }
    else {
      cVar1 = *plVar4->thousands_sep;
    }
  }
  commaPrintBufs[uVar5][0x1d] = '\0';
  local_18 = commaPrintBufs[uVar5] + 0x1d;
  local_8 = in_RDI;
  while( true ) {
    if ((local_1c % 3 == 0) && (local_1c != 0)) {
      local_18[-1] = cVar1;
      local_18 = local_18 + -1;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_8;
    pcVar6 = local_18 + -1;
    local_18[-1] = SUB161(auVar2 % ZEXT816(10),0) + '0';
    local_8 = local_8 / 10;
    bVar7 = SCARRY4(local_1c,1);
    local_1c = local_1c + 1;
    if (bVar7) break;
    local_18 = pcVar6;
    if (local_8 == 0) {
      commaPrintBufIndex = commaPrintBufIndex + '\x01';
      return pcVar6;
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

char * comma_print(unsigned long n)
{
	int comma = '\0';
	char *p;
	int i = 0;

	if(commaPrintBufIndex>=16)
		commaPrintBufIndex = 0;

	p = &commaPrintBufs[commaPrintBufIndex][sizeof(commaPrintBufs[commaPrintBufIndex])-1];

	if(comma == '\0')
	{
		struct lconv *lcp = localeconv();
		if(lcp != NULL)
		{
			if(lcp->thousands_sep != NULL && *lcp->thousands_sep != '\0')
				comma = *lcp->thousands_sep;
			else
				comma = ',';
		}
	}

	*p = '\0';

	do
	{
		if(i%3 == 0 && i != 0)
			*--p = comma;

		*--p = '0' + n % 10;
		n /= 10;
		i++;
	} while(n != 0);

	commaPrintBufIndex++;
	return p;
}